

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_scan.cpp
# Opt level: O3

OperatorPartitionData *
duckdb::TableScanGetPartitionData
          (OperatorPartitionData *__return_storage_ptr__,ClientContext *context,
          TableFunctionGetPartitionInput *input)

{
  GlobalTableFunctionState *pGVar1;
  InternalException *this;
  string local_40;
  
  if ((input->partition_info->partition_columns).
      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (input->partition_info->partition_columns).
      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    optional_ptr<duckdb::GlobalTableFunctionState,_true>::CheckValid(&input->global_state);
    pGVar1 = (input->global_state).ptr;
    (*pGVar1->_vptr_GlobalTableFunctionState[6])(__return_storage_ptr__,pGVar1,context,input);
    return __return_storage_ptr__;
  }
  this = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"TableScan::GetPartitionData: partition columns not supported","");
  InternalException::InternalException(this,&local_40);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

OperatorPartitionData TableScanGetPartitionData(ClientContext &context, TableFunctionGetPartitionInput &input) {
	if (input.partition_info.RequiresPartitionColumns()) {
		throw InternalException("TableScan::GetPartitionData: partition columns not supported");
	}

	auto &g_state = input.global_state->Cast<TableScanGlobalState>();
	return g_state.TableScanGetPartitionData(context, input);
}